

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O3

void __thiscall
ear::PolarExtentCoreSimd<xsimd::avx>::run
          (PolarExtentCoreSimd<xsimd::avx> *this,PolarExtentCoreContext *ctx)

{
  float fVar1;
  float fVar2;
  size_t sVar3;
  size_t sVar4;
  extent_float_t *peVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float *pfVar10;
  PositionBatch<xsimd::batch<float,_xsimd::avx>_> *position;
  ulong uVar11;
  PolarExtentCoreContext *extraout_RDX;
  PolarExtentCoreContext *extraout_RDX_00;
  PolarExtentCoreContext *extraout_RDX_01;
  PolarExtentCoreContext *ctx_00;
  float *pfVar12;
  long lVar13;
  size_t sVar14;
  long lVar15;
  ulong uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  float fVar21;
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  PositionBatch<xsimd::batch<float,_xsimd::avx>_> pos;
  simd_register<float,_xsimd::avx> cos_angle;
  undefined1 local_c0 [32];
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  
  ctx_00 = (PolarExtentCoreContext *)ctx->num_speakers;
  if (ctx_00 != (PolarExtentCoreContext *)0x0) {
    memset(ctx->results,0,(long)ctx_00 << 2);
    ctx_00 = extraout_RDX;
  }
  if (ctx->num_points != 0) {
    lVar15 = 0;
    cos_angle.data =
         (register_type)vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x40),ZEXT1632(ZEXT816(0) << 0x40),0xf);
    uVar16 = 0;
    do {
      if (((ulong)(ctx->xs + uVar16) & 0x1f) != 0) {
LAB_00148cfa:
        __assert_fail("((reinterpret_cast<uintptr_t>(mem) % A::alignment()) == 0) && \"loaded pointer is not properly aligned\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/xsimd/include/xsimd/types/xsimd_batch.hpp"
                      ,0x268,
                      "static batch<T, A> xsimd::batch<float>::load_aligned(const U *) [T = float, A = xsimd::avx, U = float]"
                     );
      }
      local_c0 = *(undefined1 (*) [32])(ctx->xs + uVar16);
      position = (PositionBatch<xsimd::batch<float,_xsimd::avx>_> *)(ctx->ys + uVar16);
      if (((ulong)position & 0x1f) != 0) goto LAB_00148cfa;
      local_a0 = (position->x).super_simd_register<float,_xsimd::avx>.data[0];
      fStack_9c = (position->x).super_simd_register<float,_xsimd::avx>.data[1];
      fStack_98 = (position->x).super_simd_register<float,_xsimd::avx>.data[2];
      fStack_94 = (position->x).super_simd_register<float,_xsimd::avx>.data[3];
      fStack_90 = (position->x).super_simd_register<float,_xsimd::avx>.data[4];
      fStack_8c = (position->x).super_simd_register<float,_xsimd::avx>.data[5];
      fStack_88 = (position->x).super_simd_register<float,_xsimd::avx>.data[6];
      fStack_84 = (position->x).super_simd_register<float,_xsimd::avx>.data[7];
      pfVar10 = ctx->zs + uVar16;
      if (((ulong)pfVar10 & 0x1f) != 0) goto LAB_00148cfa;
      local_80 = *pfVar10;
      fStack_7c = pfVar10[1];
      fStack_78 = pfVar10[2];
      fStack_74 = pfVar10[3];
      fStack_70 = pfVar10[4];
      fStack_6c = pfVar10[5];
      fStack_68 = pfVar10[6];
      fStack_64 = pfVar10[7];
      if (ctx->is_circular == true) {
        fVar21 = ctx->flippedBasis[3];
        fVar1 = ctx->flippedBasis[4];
        fVar2 = ctx->flippedBasis[5];
        auVar17._0_4_ = local_c0._0_4_ * fVar21 + local_a0 * fVar1 + local_80 * fVar2;
        auVar17._4_4_ = local_c0._4_4_ * fVar21 + fStack_9c * fVar1 + fStack_7c * fVar2;
        auVar17._8_4_ = local_c0._8_4_ * fVar21 + fStack_98 * fVar1 + fStack_78 * fVar2;
        auVar17._12_4_ = local_c0._12_4_ * fVar21 + fStack_94 * fVar1 + fStack_74 * fVar2;
        auVar17._16_4_ = local_c0._16_4_ * fVar21 + fStack_90 * fVar1 + fStack_70 * fVar2;
        auVar17._20_4_ = local_c0._20_4_ * fVar21 + fStack_8c * fVar1 + fStack_6c * fVar2;
        auVar17._24_4_ = local_c0._24_4_ * fVar21 + fStack_88 * fVar1 + fStack_68 * fVar2;
        auVar17._28_4_ = local_c0._28_4_ + fStack_84 + fStack_64;
        weight_from_cos((batch *)this,(PolarExtentCoreSimd<xsimd::avx> *)ctx,ctx_00,
                        (batch)cos_angle.data);
        ctx_00 = extraout_RDX_00;
      }
      else {
        auVar17 = local_c0;
        weight_stadium((batch *)this,(PolarExtentCoreSimd<xsimd::avx> *)ctx,
                       (PolarExtentCoreContext *)local_c0,position);
        ctx_00 = extraout_RDX_01;
      }
      auVar19._8_4_ = 0x3f800000;
      auVar19._0_8_ = 0x3f8000003f800000;
      auVar19._12_4_ = 0x3f800000;
      auVar19._16_4_ = 0x3f800000;
      auVar19._20_4_ = 0x3f800000;
      auVar19._24_4_ = 0x3f800000;
      auVar19._28_4_ = 0x3f800000;
      auVar19 = vcmpps_avx(auVar17,auVar19,0);
      auVar19 = (undefined1  [32])cos_angle.data & ~auVar19;
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar19 >> 0x7f,0) == '\0') &&
            (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar19 >> 0xbf,0) == '\0') &&
          (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar19[0x1f])
      {
        ctx_00 = (PolarExtentCoreContext *)ctx->num_speakers;
        if (ctx_00 != (PolarExtentCoreContext *)0x0) {
          uVar11 = 0;
          do {
            pfVar10 = ctx->summed_panning_results + uVar11 + (long)ctx_00 * (uVar16 >> 3);
            if ((((ulong)pfVar10 & 0x1f) != 0) ||
               (pfVar12 = ctx->results + uVar11, ((ulong)pfVar12 & 0x1f) != 0)) goto LAB_00148cfa;
            fVar21 = pfVar10[1];
            fVar1 = pfVar10[2];
            fVar2 = pfVar10[3];
            fVar6 = pfVar10[4];
            fVar7 = pfVar10[5];
            fVar8 = pfVar10[6];
            fVar9 = pfVar10[7];
            *pfVar12 = *pfVar10 + *pfVar12;
            pfVar12[1] = fVar21 + pfVar12[1];
            pfVar12[2] = fVar1 + pfVar12[2];
            pfVar12[3] = fVar2 + pfVar12[3];
            pfVar12[4] = fVar6 + pfVar12[4];
            pfVar12[5] = fVar7 + pfVar12[5];
            pfVar12[6] = fVar8 + pfVar12[6];
            pfVar12[7] = fVar9 + pfVar12[7];
            uVar11 = uVar11 + 8;
            ctx_00 = (PolarExtentCoreContext *)ctx->num_speakers;
          } while (uVar11 < ctx_00);
        }
      }
      else {
        auVar19 = vcmpps_avx(auVar17,_DAT_001c92e0,0);
        auVar20 = ZEXT3264(auVar19);
        auVar19 = (undefined1  [32])cos_angle.data & ~auVar19;
        if (((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                  (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                SUB321(auVar19 >> 0x7f,0) != '\0') ||
               (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              SUB321(auVar19 >> 0xbf,0) != '\0') ||
             (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             auVar19[0x1f] < '\0') && (sVar3 = ctx->real_num_speakers, sVar3 != 0)) {
          sVar4 = ctx->num_points;
          ctx_00 = (PolarExtentCoreContext *)ctx->panning_results;
          peVar5 = ctx->results;
          sVar14 = 0;
          lVar13 = lVar15;
          do {
            if (((int)ctx_00 + (int)lVar13 & 0x1fU) != 0) goto LAB_00148cfa;
            pfVar10 = (float *)((long)ctx_00->flippedBasis + lVar13 + -0x44);
            fVar21 = auVar17._4_4_ * pfVar10[1];
            auVar18._0_4_ = auVar17._0_4_ * *pfVar10 + auVar17._16_4_ * pfVar10[4];
            auVar18._4_4_ = fVar21 + fVar21;
            auVar18._8_4_ = auVar17._8_4_ * pfVar10[2] + auVar17._24_4_ * pfVar10[6];
            auVar18._12_4_ = auVar17._12_4_ * pfVar10[3] + auVar20._28_4_;
            auVar18 = vhaddps_avx(auVar18,auVar18);
            auVar18 = vhaddps_avx(auVar18,auVar18);
            fVar21 = auVar18._0_4_ + peVar5[sVar14];
            auVar20 = ZEXT464((uint)fVar21);
            peVar5[sVar14] = fVar21;
            sVar14 = sVar14 + 1;
            lVar13 = lVar13 + sVar4 * 4;
          } while (sVar3 != sVar14);
        }
      }
      uVar16 = uVar16 + 8;
      lVar15 = lVar15 + 0x20;
    } while (uVar16 < ctx->num_points);
  }
  return;
}

Assistant:

void run(PolarExtentCoreContext &ctx) const override {
      for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
           speaker_idx++)
        ctx.results[speaker_idx] = 0.0;

      for (size_t i = 0; i < ctx.num_points; i += batch::size) {
        PositionBatch<batch> pos;
        pos.x = batch::load_aligned(ctx.xs + i);
        pos.y = batch::load_aligned(ctx.ys + i);
        pos.z = batch::load_aligned(ctx.zs + i);

        batch weight = ctx.is_circular ? weight_circle(ctx, pos)
                                       : weight_stadium(ctx, pos);

        bool all_zeros = xsimd::all(weight == 0.0);
        bool all_ones = xsimd::all(weight == 1.0);
        if (all_ones) {
          // add pre-computed sum for this batch
          size_t batch_i = i / batch::size;
          for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
               speaker_idx += batch::size) {
            batch gain =
                batch::load_aligned(ctx.summed_panning_results +
                                    (batch_i * ctx.num_speakers) + speaker_idx);

            extent_float_t *result_ptr = ctx.results + speaker_idx;
            xsimd::store_aligned(result_ptr,
                                 batch::load_aligned(result_ptr) + gain);
          }
        } else if (!all_zeros) {
          for (size_t speaker_idx = 0; speaker_idx < ctx.real_num_speakers;
               speaker_idx++) {
            batch gain = batch::load_aligned(ctx.panning_results +
                                             speaker_idx * ctx.num_points + i);
            ctx.results[speaker_idx] += xsimd::reduce_add(gain * weight);
          }
        }
      }
    }